

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O2

bool utf8::CharsAreEqual(LPCOLESTR pch,LPCUTF8 bch,LPCUTF8 end,DecodeOptions options)

{
  char16 cVar1;
  LPCUTF8 puVar2;
  char16 cVar3;
  DecodeOptions local_3c;
  LPCUTF8 puStack_38;
  DecodeOptions localOptions;
  LPCUTF8 bch_local;
  
  local_3c = options;
  puStack_38 = bch;
  do {
    puVar2 = puStack_38;
    if (end <= puStack_38) break;
    cVar1 = *pch;
    pch = pch + 1;
    cVar3 = Decode(&stack0xffffffffffffffc8,end,&local_3c,(bool *)0x0);
  } while (cVar1 == cVar3);
  return end <= puVar2;
}

Assistant:

bool CharsAreEqual(LPCOLESTR pch, LPCUTF8 bch, LPCUTF8 end, DecodeOptions options)
    {
        DecodeOptions localOptions = options;
        while (bch < end)
        {
            if (*pch++ != utf8::Decode(bch, end, localOptions))
            {
                return false;
            }
        }
        return true;
    }